

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGSpatialSort.cpp
# Opt level: O3

void __thiscall
Assimp::SGSpatialSort::FindPositions
          (SGSpatialSort *this,aiVector3D *pPosition,uint32_t pSG,float pRadius,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *poResults,bool exactMatch)

{
  pointer *ppuVar1;
  float fVar2;
  pointer puVar3;
  pointer pEVar4;
  iterator iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  float *pfVar11;
  pointer pEVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  fVar15 = pPosition->x;
  fVar17 = pPosition->y;
  fVar13 = (this->mPlaneNormal).y;
  fVar14 = (this->mPlaneNormal).x;
  fVar16 = pPosition->z;
  fVar2 = (this->mPlaneNormal).z;
  puVar3 = (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
  }
  pEVar12 = (this->mPositions).
            super__Vector_base<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (this->mPositions).
           super__Vector_base<Assimp::SGSpatialSort::Entry,_std::allocator<Assimp::SGSpatialSort::Entry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar12 != pEVar4) {
    fVar15 = fVar16 * fVar2 + fVar15 * fVar14 + fVar17 * fVar13;
    fVar17 = fVar15 + pRadius;
    if ((pEVar12->mDistance <= fVar17) &&
       (fVar15 = fVar15 - pRadius, fVar15 < pEVar4[-1].mDistance || fVar15 == pEVar4[-1].mDistance))
    {
      uVar6 = ((long)pEVar4 - (long)pEVar12 >> 3) * -0x5555555555555555;
      uVar9 = uVar6 >> 1 & 0x7fffffff;
      if ((uint)uVar6 < 8) {
        uVar10 = (uint)uVar9;
      }
      else {
        uVar8 = uVar6 >> 2 & 0x3fffffff;
        do {
          uVar7 = (uint)uVar8;
          uVar10 = uVar7;
          if (fVar15 < pEVar12[uVar9].mDistance || fVar15 == pEVar12[uVar9].mDistance) {
            uVar10 = -uVar7;
          }
          uVar10 = uVar10 + (int)uVar9;
          uVar8 = uVar8 >> 1;
          uVar9 = (ulong)uVar10;
        } while (3 < uVar7);
      }
      uVar7 = 0;
      if (uVar10 != 0) {
        uVar9 = (ulong)uVar10;
        pfVar11 = &pEVar12[uVar9].mDistance;
        do {
          if (*pfVar11 <= fVar15) {
            uVar7 = (uint)uVar9;
            break;
          }
          uVar9 = uVar9 - 1;
          pfVar11 = pfVar11 + -6;
        } while ((int)uVar9 != 0);
      }
      do {
        uVar9 = (ulong)uVar7;
        if (uVar6 - 1 <= uVar9) break;
        uVar7 = uVar7 + 1;
      } while (pEVar12[uVar9].mDistance <= fVar15 && fVar15 != pEVar12[uVar9].mDistance);
      fVar15 = pRadius * pRadius;
      pEVar12 = pEVar12 + uVar9;
      if (exactMatch) {
        do {
          if (fVar17 < pEVar12->mDistance || fVar17 == pEVar12->mDistance) {
            return;
          }
          fVar16 = (pEVar12->mPosition).x - pPosition->x;
          fVar13 = (pEVar12->mPosition).y - pPosition->y;
          fVar14 = (pEVar12->mPosition).z - pPosition->z;
          if ((fVar14 * fVar14 + fVar16 * fVar16 + fVar13 * fVar13 < fVar15) &&
             (pEVar12->mSmoothGroups == pSG)) {
            iVar5._M_current =
                 (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)poResults,iVar5,
                         &pEVar12->mIndex);
            }
            else {
              *iVar5._M_current = pEVar12->mIndex;
              ppuVar1 = &(poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
          }
          pEVar12 = pEVar12 + 1;
        } while (pEVar12 != pEVar4);
      }
      else if (pSG == 0) {
        do {
          if (fVar17 < pEVar12->mDistance || fVar17 == pEVar12->mDistance) {
            return;
          }
          fVar16 = (pEVar12->mPosition).x - pPosition->x;
          fVar13 = (pEVar12->mPosition).y - pPosition->y;
          fVar14 = (pEVar12->mPosition).z - pPosition->z;
          if (fVar14 * fVar14 + fVar16 * fVar16 + fVar13 * fVar13 < fVar15) {
            iVar5._M_current =
                 (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)poResults,iVar5,
                         &pEVar12->mIndex);
            }
            else {
              *iVar5._M_current = pEVar12->mIndex;
              ppuVar1 = &(poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
          }
          pEVar12 = pEVar12 + 1;
        } while (pEVar12 != pEVar4);
      }
      else {
        do {
          if (fVar17 < pEVar12->mDistance || fVar17 == pEVar12->mDistance) {
            return;
          }
          fVar16 = (pEVar12->mPosition).x - pPosition->x;
          fVar13 = (pEVar12->mPosition).y - pPosition->y;
          fVar14 = (pEVar12->mPosition).z - pPosition->z;
          if ((fVar14 * fVar14 + fVar16 * fVar16 + fVar13 * fVar13 < fVar15) &&
             (pEVar12->mSmoothGroups == 0 || (pEVar12->mSmoothGroups & pSG) != 0)) {
            iVar5._M_current =
                 (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)poResults,iVar5,
                         &pEVar12->mIndex);
            }
            else {
              *iVar5._M_current = pEVar12->mIndex;
              ppuVar1 = &(poResults->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppuVar1 = *ppuVar1 + 1;
            }
          }
          pEVar12 = pEVar12 + 1;
        } while (pEVar12 != pEVar4);
      }
    }
  }
  return;
}

Assistant:

void SGSpatialSort::FindPositions( const aiVector3D& pPosition,
    uint32_t pSG,
    float pRadius,
    std::vector<unsigned int>& poResults,
    bool exactMatch /*= false*/) const
{
    float dist = pPosition * mPlaneNormal;
    float minDist = dist - pRadius, maxDist = dist + pRadius;

    // clear the array
    poResults.clear();

    // quick check for positions outside the range
    if( mPositions.empty() )
        return;
    if( maxDist < mPositions.front().mDistance)
        return;
    if( minDist > mPositions.back().mDistance)
        return;

    // do a binary search for the minimal distance to start the iteration there
    unsigned int index = (unsigned int)mPositions.size() / 2;
    unsigned int binaryStepSize = (unsigned int)mPositions.size() / 4;
    while( binaryStepSize > 1)
    {
        if( mPositions[index].mDistance < minDist)
            index += binaryStepSize;
        else
            index -= binaryStepSize;

        binaryStepSize /= 2;
    }

    // depending on the direction of the last step we need to single step a bit back or forth
    // to find the actual beginning element of the range
    while( index > 0 && mPositions[index].mDistance > minDist)
        index--;
    while( index < (mPositions.size() - 1) && mPositions[index].mDistance < minDist)
        index++;

    // Mow start iterating from there until the first position lays outside of the distance range.
    // Add all positions inside the distance range within the given radius to the result aray

    float squareEpsilon = pRadius * pRadius;
    std::vector<Entry>::const_iterator it  = mPositions.begin() + index;
    std::vector<Entry>::const_iterator end = mPositions.end();

    if (exactMatch)
    {
        while( it->mDistance < maxDist)
        {
            if((it->mPosition - pPosition).SquareLength() < squareEpsilon && it->mSmoothGroups == pSG)
            {
                poResults.push_back( it->mIndex);
            }
            ++it;
            if( end == it )break;
        }
    }
    else
    {
        // if the given smoothing group is 0, we'll return all surrounding vertices
        if (!pSG)
        {
            while( it->mDistance < maxDist)
            {
                if((it->mPosition - pPosition).SquareLength() < squareEpsilon)
                    poResults.push_back( it->mIndex);
                ++it;
                if( end == it)break;
            }
        }
        else while( it->mDistance < maxDist)
        {
            if((it->mPosition - pPosition).SquareLength() < squareEpsilon &&
                (it->mSmoothGroups & pSG || !it->mSmoothGroups))
            {
                poResults.push_back( it->mIndex);
            }
            ++it;
            if( end == it)break;
        }
    }
}